

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
          (cmCPackPropertiesGenerator *this,cmMakefile *mf,cmInstalledFile *installedFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"CPACK_BUILD_CONFIG",&local_49);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_48,configurations);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmScriptGenerator_005c35c0;
  this->Makefile = mf;
  this->InstalledFile = installedFile;
  (this->super_cmScriptGenerator).ActionsPerConfig = true;
  return;
}

Assistant:

cmCPackPropertiesGenerator::cmCPackPropertiesGenerator(
  cmMakefile* mf,
  cmInstalledFile const& installedFile,
  std::vector<std::string> const& configurations):
    cmScriptGenerator("CPACK_BUILD_CONFIG", configurations),
    Makefile(mf),
    InstalledFile(installedFile)
{
  this->ActionsPerConfig = true;
}